

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

int addk(FuncState *fs,TValue *key,TValue *v)

{
  Proto *o;
  lua_State *L;
  int iVar1;
  TValue *pTVar2;
  long lVar3;
  lu_byte *plVar4;
  Value VVar5;
  int iVar6;
  TValue val;
  Value local_40;
  undefined1 local_38;
  
  o = fs->f;
  L = fs->ls->L;
  pTVar2 = luaH_get(fs->ls->h,key);
  if ((pTVar2->tt_ == '\x03') && (iVar6 = (int)(pTVar2->value_).i, iVar6 < fs->nk)) {
    if ((((v->tt_ ^ o->k[iVar6].tt_) & 0x3f) == 0) &&
       (iVar1 = luaV_equalobj((lua_State *)0x0,o->k + iVar6,v), iVar1 != 0)) {
      return iVar6;
    }
  }
  iVar6 = o->sizek;
  iVar1 = fs->nk;
  VVar5 = (Value)(long)iVar1;
  local_38 = 3;
  local_40 = VVar5;
  luaH_finishset(L,fs->ls->h,key,pTVar2,(TValue *)&local_40);
  pTVar2 = (TValue *)luaM_growaux_(L,o->k,iVar1,&o->sizek,0x10,0x1ffffff,"constants");
  o->k = pTVar2;
  if (iVar6 < o->sizek) {
    lVar3 = (long)o->sizek - (long)iVar6;
    plVar4 = &pTVar2[iVar6].tt_;
    do {
      *plVar4 = '\0';
      plVar4 = plVar4 + 0x10;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  pTVar2[VVar5.i].value_ = v->value_;
  pTVar2[VVar5.i].tt_ = v->tt_;
  fs->nk = fs->nk + 1;
  if ((((v->tt_ & 0x40) != 0) && ((o->marked & 0x20) != 0)) &&
     ((((v->value_).gc)->marked & 0x18) != 0)) {
    luaC_barrier_(L,(GCObject *)o,(v->value_).gc);
  }
  return iVar1;
}

Assistant:

static int addk (FuncState *fs, TValue *key, TValue *v) {
  TValue val;
  lua_State *L = fs->ls->L;
  Proto *f = fs->f;
  const TValue *idx = luaH_get(fs->ls->h, key);  /* query scanner table */
  int k, oldsize;
  if (ttisinteger(idx)) {  /* is there an index there? */
    k = cast_int(ivalue(idx));
    /* correct value? (warning: must distinguish floats from integers!) */
    if (k < fs->nk && ttypetag(&f->k[k]) == ttypetag(v) &&
                      luaV_rawequalobj(&f->k[k], v))
      return k;  /* reuse index */
  }
  /* constant not found; create a new entry */
  oldsize = f->sizek;
  k = fs->nk;
  /* numerical value does not need GC barrier;
     table has no metatable, so it does not need to invalidate cache */
  setivalue(&val, k);
  luaH_finishset(L, fs->ls->h, key, idx, &val);
  luaM_growvector(L, f->k, k, f->sizek, TValue, MAXARG_Ax, "constants");
  while (oldsize < f->sizek) setnilvalue(&f->k[oldsize++]);
  setobj(L, &f->k[k], v);
  fs->nk++;
  luaC_barrier(L, f, v);
  return k;
}